

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O0

void __thiscall
gl4cts::anon_unknown_0::PIQBase::VerifyGetProgramResourceIndex
          (PIQBase *this,GLuint program,GLenum programInterface,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          *indices,string *name,long *error)

{
  GLuint GVar1;
  bool bVar2;
  GLchar *name_00;
  pointer ppVar3;
  mapped_type *pmVar4;
  _Self local_48;
  _Self local_40;
  iterator it;
  GLuint res;
  long *error_local;
  string *name_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *indices_local;
  GLenum programInterface_local;
  GLuint program_local;
  PIQBase *this_local;
  
  name_00 = (GLchar *)std::__cxx11::string::c_str();
  it._M_node._4_4_ =
       glu::CallLogWrapper::glGetProgramResourceIndex
                 (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,program,
                  programInterface,name_00);
  if (it._M_node._4_4_ == 0xffffffff) {
    anon_unknown_0::Output("ERROR: Got %d, expected number other than -1\n",0xffffffff);
    *error = -1;
  }
  else {
    local_40._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         ::begin(indices);
    while( true ) {
      local_48._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::end(indices);
      bVar2 = std::operator!=(&local_40,&local_48);
      GVar1 = it._M_node._4_4_;
      if (!bVar2) break;
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
               ::operator->(&local_40);
      if (ppVar3->second == it._M_node._4_4_) {
        anon_unknown_0::Output("ERROR: Duplicated value found: %d\n",(ulong)it._M_node._4_4_);
        *error = -1;
        return;
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
      ::operator++(&local_40);
    }
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ::operator[](indices,name);
    *pmVar4 = GVar1;
  }
  return;
}

Assistant:

virtual inline void VerifyGetProgramResourceIndex(GLuint program, GLenum		 programInterface,
													  std::map<std::string, GLuint>& indices, const std::string& name,
													  long& error)
	{
		GLuint res = glGetProgramResourceIndex(program, programInterface, name.c_str());
		if (res == GL_INVALID_INDEX)
		{
			Output("ERROR: Got %d, expected number other than -1\n", res);
			error = ERROR;
			return;
		}
		std::map<std::string, GLuint>::iterator it = indices.begin();
		while (it != indices.end())
		{
			if (it->second == res)
			{
				Output("ERROR: Duplicated value found: %d\n", res);
				error = ERROR;
				return;
			}
			++it;
		}
		indices[name] = res;
	}